

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::rescalePartialsByPartition
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *destP,float *scaleFactors,
          float *cumulativeScaleFactors,int fillWithOnes,int partitionIndex)

{
  float *pfVar1;
  float *pfVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  undefined8 uVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar16;
  int iVar17;
  float fVar18;
  double dVar19;
  undefined1 auVar20 [16];
  float fVar21;
  uint local_38;
  long lVar15;
  
  piVar4 = (this->super_BeagleCPUImpl<float,_1,_0>).gPatternPartitionsStartPatterns;
  iVar17 = piVar4[partitionIndex];
  lVar16 = (long)iVar17;
  iVar3 = piVar4[(long)partitionIndex + 1];
  if (iVar17 < iVar3) {
    lVar5 = (this->super_BeagleCPUImpl<float,_1,_0>).kFlags;
    iVar17 = iVar17 * 4;
    do {
      fVar18 = 1.0;
      iVar11 = (this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
      if (0 < iVar11) {
        auVar20 = ZEXT816(0);
        iVar12 = iVar11;
        iVar13 = iVar17;
        do {
          lVar14 = (long)iVar13;
          auVar20 = vmaxss_avx(ZEXT416((uint)destP[iVar13]),auVar20);
          auVar20 = vmaxss_avx(ZEXT416((uint)destP[(long)iVar13 + 1]),auVar20);
          lVar15 = (long)iVar13;
          iVar13 = iVar13 + (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount * 4;
          iVar12 = iVar12 + -1;
          auVar20 = vmaxss_avx(ZEXT416((uint)destP[lVar14 + 2]),auVar20);
          auVar20 = vmaxss_avx(ZEXT416((uint)destP[lVar15 + 3]),auVar20);
        } while (iVar12 != 0);
        uVar6 = vcmpss_avx512f(auVar20,ZEXT416(0),0);
        bVar7 = (bool)((byte)uVar6 & 1);
        fVar18 = (float)((uint)bVar7 * 0x3f800000 + (uint)!bVar7 * auVar20._0_4_);
        if (0 < iVar11) {
          iVar13 = (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount;
          fVar21 = 1.0 / fVar18;
          iVar12 = iVar17;
          do {
            pfVar1 = destP + iVar12;
            fVar8 = pfVar1[1];
            fVar9 = pfVar1[2];
            fVar10 = pfVar1[3];
            pfVar2 = destP + iVar12;
            *pfVar2 = fVar21 * *pfVar1;
            pfVar2[1] = fVar21 * fVar8;
            pfVar2[2] = fVar21 * fVar9;
            pfVar2[3] = fVar21 * fVar10;
            iVar12 = iVar12 + iVar13 * 4;
            iVar11 = iVar11 + -1;
          } while (iVar11 != 0);
        }
      }
      local_38 = (uint)lVar5;
      if ((local_38 >> 10 & 1) == 0) {
        scaleFactors[lVar16] = fVar18;
        if (cumulativeScaleFactors != (float *)0x0) {
          dVar19 = log((double)fVar18);
          fVar18 = (float)(dVar19 + (double)cumulativeScaleFactors[lVar16]);
LAB_0013a451:
          cumulativeScaleFactors[lVar16] = fVar18;
        }
      }
      else {
        dVar19 = log((double)fVar18);
        scaleFactors[lVar16] = (float)dVar19;
        if (cumulativeScaleFactors != (float *)0x0) {
          fVar18 = (float)dVar19 + cumulativeScaleFactors[lVar16];
          goto LAB_0013a451;
        }
      }
      lVar16 = lVar16 + 1;
      iVar17 = iVar17 + 4;
    } while (lVar16 != iVar3);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::rescalePartialsByPartition(
                                                                    REALTYPE* destP,
                                                                    REALTYPE* scaleFactors,
                                                                    REALTYPE* cumulativeScaleFactors,
                                                                    const int fillWithOnes,
                                                                    const int partitionIndex) {

    bool useLogScalars = kFlags & BEAGLE_FLAG_SCALERS_LOG;

    int startPattern = gPatternPartitionsStartPatterns[partitionIndex];
    int endPattern = gPatternPartitionsStartPatterns[partitionIndex + 1];

    for (int k = startPattern; k < endPattern; k++) {
      REALTYPE max = 0;
        const int patternOffset = k * 4;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;

#ifdef BEAGLE_TEST_OPTIMIZATION
            REALTYPE max01 = FAST_MAX(destP[offset + 0], destP[offset + 1]);
            REALTYPE max23 = FAST_MAX(destP[offset + 2], destP[offset + 3]);
            max = FAST_MAX(max, max01);
            max = FAST_MAX(max, max23);
#else
      #pragma unroll
            for (int i = 0; i < 4; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
#endif
        }

        if (max == 0)
            max = REALTYPE(1.0);

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;
      #pragma unroll
            for (int i = 0; i < 4; i++)
                destP[offset++] *= oneOverMax;
        }

        if (useLogScalars) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}